

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.h
# Opt level: O2

ImageSpec * __thiscall
ImageInput::spec(ImageSpec *__return_storage_ptr__,ImageInput *this,uint32_t param_1,
                uint32_t param_2)

{
  *(undefined8 *)&(__return_storage_ptr__->formatDesc).basic = 0;
  *(undefined8 *)&(__return_storage_ptr__->formatDesc).basic.field_0x8 = 0;
  *(undefined8 *)&(__return_storage_ptr__->formatDesc).basic.field_0xd = 0;
  (__return_storage_ptr__->formatDesc).extended.oeGamma = -1.0;
  (__return_storage_ptr__->formatDesc).extended.iccProfile.name._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->formatDesc).extended.iccProfile.name.field_2;
  (__return_storage_ptr__->formatDesc).extended.iccProfile.name._M_string_length = 0;
  (__return_storage_ptr__->formatDesc).extended.iccProfile.name.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->formatDesc).extended.iccProfile.profile.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(__return_storage_ptr__->formatDesc).extended.iccProfile.profile.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(__return_storage_ptr__->formatDesc).extended.iccProfile.profile.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (__return_storage_ptr__->formatDesc).samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->formatDesc).samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->formatDesc).samples.
  super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->formatDesc).samples.
           super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 7) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->imageHeight + 3) = 0;
  if ((ulong)this->curSubimage <
      (ulong)((*(long *)&this->field_0x298 - *(long *)&this->images) / 0x90)) {
    ImageSpec::operator=
              (__return_storage_ptr__,
               (ImageSpec *)(*(long *)&this->images + (ulong)this->curSubimage * 0x90));
  }
  return __return_storage_ptr__;
}

Assistant:

virtual ImageSpec spec (uint32_t /*subimage*/, uint32_t /*miplevel=0*/) {
        ImageSpec ret;
        if (curSubimage < images.size()) {
            ret = images[curSubimage].spec;
        }
        return ret;
    }